

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O0

void __thiscall
ki::protocol::control::SessionAccept::read_from(SessionAccept *this,istream *istream)

{
  unsigned_short uVar1;
  int iVar2;
  uint uVar3;
  Field<int> *pFVar4;
  Field<unsigned_int> *pFVar5;
  Field<unsigned_short> *pFVar6;
  ostringstream oss;
  parse_error *e;
  string local_150 [32];
  Field<unsigned_short> *local_130;
  Field<unsigned_short> *session_id;
  string local_120 [32];
  Field<unsigned_int> *local_100;
  Field<unsigned_int> *milliseconds;
  string local_f0 [32];
  Field<int> *local_d0;
  Field<int> *timestamp;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  istream *istream_local;
  SessionAccept *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)istream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"unknown",&local_89);
  ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_88,true);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"unknown2",(allocator *)((long)&timestamp + 7));
  ki::dml::Record::add_field<unsigned_int>((Record *)local_68,(string *)local_c0,true);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&timestamp + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"m_timestamp",(allocator *)((long)&milliseconds + 7));
  pFVar4 = ki::dml::Record::add_field<int>((Record *)local_68,(string *)local_f0,true);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&milliseconds + 7));
  local_d0 = pFVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"m_milliseconds",(allocator *)((long)&session_id + 7));
  pFVar5 = ki::dml::Record::add_field<unsigned_int>((Record *)local_68,(string *)local_120,true);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&session_id + 7));
  local_100 = pFVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"m_session_id",(allocator *)((long)&e + 7));
  pFVar6 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_150,true);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_130 = pFVar6;
  ki::dml::Record::read_from
            ((Record *)local_68,
             (istream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar2 = ki::dml::Field<int>::get_value(local_d0);
  this->m_timestamp = iVar2;
  uVar3 = ki::dml::Field<unsigned_int>::get_value(local_100);
  this->m_milliseconds = uVar3;
  uVar1 = ki::dml::Field<unsigned_short>::get_value(local_130);
  this->m_session_id = uVar1;
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void SessionAccept::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		auto *milliseconds = record.add_field<dml::UINT>("m_milliseconds");
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading SessionAccept payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
		m_milliseconds = milliseconds->get_value();
		m_session_id = session_id->get_value();
	}